

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineImageUtil.cpp
# Opt level: O2

bool vkt::pipeline::isSupportedSamplableFormat
               (InstanceInterface *instanceInterface,VkPhysicalDevice device,VkFormat format)

{
  bool bVar1;
  CompressedTexFormat format_00;
  VkFormatProperties formatProps;
  undefined1 local_104 [4];
  byte local_100;
  int local_b4;
  int local_b0;
  
  bVar1 = ::vk::isCompressedFormat(format);
  if (bVar1) {
    format_00 = ::vk::mapVkCompressedFormat(format);
    (*instanceInterface->_vptr_InstanceInterface[2])(instanceInterface,device,local_104);
    bVar1 = tcu::isAstcFormat(format_00);
    if (((bVar1) || (bVar1 = tcu::isEtcFormat(format_00), local_b0 = local_b4, bVar1)) &&
       (local_b0 == 0)) {
      return false;
    }
  }
  (*instanceInterface->_vptr_InstanceInterface[3])(instanceInterface,device,(ulong)format,local_104)
  ;
  return (bool)(local_100 & 1);
}

Assistant:

bool isSupportedSamplableFormat (const InstanceInterface& instanceInterface, VkPhysicalDevice device, VkFormat format)
{
	if (isCompressedFormat(format))
	{
		VkPhysicalDeviceFeatures		physicalFeatures;
		const tcu::CompressedTexFormat	compressedFormat	= mapVkCompressedFormat(format);

		instanceInterface.getPhysicalDeviceFeatures(device, &physicalFeatures);

		if (tcu::isAstcFormat(compressedFormat))
		{
			if (!physicalFeatures.textureCompressionASTC_LDR)
				return false;
		}
		else if (tcu::isEtcFormat(compressedFormat))
		{
			if (!physicalFeatures.textureCompressionETC2)
				return false;
		}
		else
		{
			DE_FATAL("Unsupported compressed format");
		}
	}

	VkFormatProperties	formatProps;
	instanceInterface.getPhysicalDeviceFormatProperties(device, format, &formatProps);

	return (formatProps.optimalTilingFeatures & VK_FORMAT_FEATURE_SAMPLED_IMAGE_BIT) != 0u;
}